

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pi_lmo4.cpp
# Opt level: O2

int64_t primecount::pi_lmo4(int64_t x)

{
  int iVar1;
  int iVar2;
  undefined1 x_00 [16];
  int *piVar3;
  long *plVar4;
  long *plVar5;
  int *piVar6;
  int *piVar7;
  bool bVar8;
  ulong uVar9;
  int64_t iVar10;
  long *plVar11;
  ulong uVar12;
  int64_t iVar13;
  int64_t iVar14;
  ulong uVar15;
  long lVar16;
  long lVar17;
  ulong uVar18;
  int64_t b;
  long lVar19;
  long lVar20;
  long res;
  ulong uVar21;
  long lVar22;
  ulong uVar23;
  uint uVar24;
  ulong uVar25;
  undefined1 in_R9B;
  ulong uVar26;
  int64_t j;
  ulong uVar27;
  size_t size;
  long lVar28;
  long lVar29;
  long lVar30;
  double dVar31;
  double dVar32;
  undefined8 in_stack_fffffffffffffe68;
  undefined8 in_stack_fffffffffffffe70;
  type primes;
  int local_164;
  Vector<bool,_std::allocator<bool>_> sieve;
  BinaryIndexedTree tree;
  long local_118;
  long local_110;
  Vector<long,_std::allocator<long>_> phi;
  Vector<long,_std::allocator<long>_> next;
  Vector<int,_std::allocator<int>_> mu;
  Vector<int,_std::allocator<int>_> lpf;
  
  if (x < 2) {
    iVar10 = 0;
  }
  else {
    x_00._8_8_ = in_stack_fffffffffffffe70;
    x_00._0_8_ = in_stack_fffffffffffffe68;
    dVar31 = get_alpha_lmo((primecount *)x,(maxint_t)x_00);
    dVar32 = cbrt((double)x);
    uVar21 = (ulong)dVar32;
    uVar15 = (long)uVar21 >> 0x3f & uVar21;
    for (; (uVar9 = uVar15, 0 < (long)uVar21 &&
           (uVar9 = uVar21,
           uVar21 * uVar21 - (ulong)x / uVar21 != 0 &&
           (long)((ulong)x / uVar21) <= (long)(uVar21 * uVar21))); uVar21 = uVar21 - 1) {
    }
    lVar16 = uVar9 - 1;
    do {
      lVar30 = lVar16 + 2;
      lVar16 = lVar16 + 1;
    } while (lVar30 * lVar30 - x / lVar30 == 0 || lVar30 * lVar30 < x / lVar30);
    uVar15 = (ulong)(dVar31 * (double)lVar16);
    if (uVar15 < 0x14) {
      uVar21 = (ulong)(byte)PhiTiny::pi[uVar15];
    }
    else {
      uVar21 = 8;
    }
    generate_primes_i32(&primes,uVar15);
    generate_lpf(&lpf,uVar15);
    generate_moebius(&mu,uVar15);
    lVar16 = (long)primes.end_ - (long)primes.array_;
    bVar8 = is_print();
    lVar30 = (lVar16 >> 2) + -1;
    uVar9 = P2((primecount *)x,uVar15,lVar30,1,(uint)bVar8,(bool)in_R9B);
    bVar8 = is_print();
    iVar10 = S1(x,uVar15,uVar21,1,bVar8);
    lVar16 = x / (long)uVar15;
    dVar31 = (double)lVar16;
    if (dVar31 < 0.0) {
      dVar31 = sqrt(dVar31);
    }
    else {
      dVar31 = SQRT(dVar31);
    }
    uVar25 = 0xb504f333;
    if ((long)dVar31 < 0xb504f333) {
      uVar25 = (long)dVar31;
    }
    if (lVar16 < (long)(uVar25 * uVar25)) {
      do {
        uVar25 = uVar25 - 1;
      } while (uVar25 * uVar25 - lVar16 != 0 && lVar16 <= (long)(uVar25 * uVar25));
    }
    else {
      lVar17 = uVar25 * 2;
      if (lVar17 < (long)(lVar16 - uVar25 * uVar25)) {
        do {
          uVar25 = uVar25 + 1;
          lVar17 = lVar17 + 2;
        } while (lVar17 < (long)(lVar16 - uVar25 * uVar25));
      }
    }
    lVar17 = 0x3f;
    if (uVar25 - 1 != 0) {
      for (; uVar25 - 1 >> lVar17 == 0; lVar17 = lVar17 + -1) {
      }
    }
    size = 1L << (-((byte)lVar17 ^ 0x3f) & 0x3f);
    if (uVar25 < 2) {
      size = 1;
    }
    tree.tree_.capacity_ = (int *)0x0;
    tree.size_ = 0;
    tree.tree_.array_ = (int *)0x0;
    tree.tree_.end_ = (int *)0x0;
    Vector<bool,_std::allocator<bool>_>::Vector(&sieve,size);
    Vector<long,_std::allocator<long>_>::Vector(&next,(long)primes.end_ - (long)primes.array_ >> 2);
    Vector<long,_std::allocator<long>_>::Vector(&phi,(long)primes.end_ - (long)primes.array_ >> 2);
    std::__copy_move<false,false,std::random_access_iterator_tag>::__copy_m<int_const*,long*>
              (primes.array_,primes.end_,next.array_);
    for (plVar11 = phi.array_; plVar11 != phi.end_; plVar11 = plVar11 + 1) {
      *plVar11 = 0;
    }
    local_118 = -1;
    local_110 = 0;
    lVar17 = 1;
    uVar25 = uVar21;
    while (lVar17 < lVar16) {
      lVar28 = size + lVar17;
      lVar29 = lVar28;
      if (lVar16 < lVar28) {
        lVar29 = lVar16;
      }
      local_164 = 1;
      std::__fill_a1<bool*,int>(sieve.array_,sieve.end_,&local_164);
      for (lVar19 = 1; lVar19 != uVar21 + 1; lVar19 = lVar19 + 1) {
        iVar1 = primes.array_[lVar19];
        for (lVar22 = next.array_[lVar19]; lVar22 < lVar29; lVar22 = lVar22 + iVar1) {
          sieve.array_[lVar22 + local_118] = false;
        }
        next.array_[lVar19] = lVar22;
      }
      tree.size_ = (ulong)((long)sieve.end_ - (long)sieve.array_) >> 1;
      Vector<int,_std::allocator<int>_>::resize(&tree.tree_,tree.size_);
      plVar5 = next.array_;
      plVar11 = phi.array_;
      piVar3 = primes.array_;
      uVar18 = tree.size_;
      if (tree.size_ < 1) {
        uVar18 = 0;
      }
      uVar12 = 0;
      while (uVar23 = uVar12, uVar23 != uVar18) {
        uVar24 = (uint)sieve.array_[uVar23 * 2];
        tree.tree_.array_[uVar23] = (uint)sieve.array_[uVar23 * 2];
        uVar27 = uVar23;
        for (uVar26 = ~uVar23 & uVar23 + 1; uVar12 = uVar23 + 1, 1 < uVar26; uVar26 = uVar26 >> 1) {
          uVar24 = uVar24 + tree.tree_.array_[uVar27 - 1];
          tree.tree_.array_[uVar23] = uVar24;
          uVar27 = uVar27 & uVar27 - 1;
        }
      }
      uVar18 = uVar25;
      while (piVar7 = lpf.array_, piVar6 = mu.array_, plVar4 = phi.array_, uVar25 = uVar25 + 1,
            (long)uVar25 < lVar30) {
        iVar1 = piVar3[uVar25];
        lVar20 = (long)iVar1;
        lVar22 = x / (lVar29 * lVar20);
        lVar19 = (long)uVar15 / lVar20;
        if ((long)uVar15 / lVar20 < lVar22) {
          lVar19 = lVar22;
        }
        uVar12 = x / (lVar17 * lVar20);
        if ((long)uVar15 <= (long)uVar12) {
          uVar12 = uVar15;
        }
        if ((long)uVar12 <= lVar20) break;
        lVar22 = uVar12 * lVar20;
        for (; lVar19 < (long)uVar12; uVar12 = uVar12 - 1) {
          iVar2 = piVar6[uVar12];
          if (((long)iVar2 != 0) && (iVar1 < piVar7[uVar12])) {
            iVar13 = anon_unknown.dwarf_7d5fc::BinaryIndexedTree::count(&tree,lVar17,x / lVar22);
            local_110 = local_110 - (iVar13 + plVar4[uVar25]) * (long)iVar2;
          }
          lVar22 = lVar22 - lVar20;
        }
        iVar13 = lVar17;
        iVar14 = anon_unknown.dwarf_7d5fc::BinaryIndexedTree::count(&tree,lVar17,lVar29 + -1);
        plVar11[uVar25] = plVar11[uVar25] + iVar14;
        for (lVar19 = plVar5[uVar25]; lVar19 < lVar29; lVar19 = lVar19 + lVar20 * 2) {
          lVar22 = lVar19 - lVar17;
          if (sieve.array_[lVar22] == true) {
            sieve.array_[lVar22] = false;
            uVar12 = lVar22 >> 1;
            do {
              tree.tree_.array_[uVar12] = tree.tree_.array_[uVar12] + -1;
              uVar12 = uVar12 | uVar12 + 1;
            } while ((long)uVar12 < tree.size_);
          }
        }
        plVar5[uVar25] = lVar19;
        lVar17 = iVar13;
      }
      local_118 = local_118 - size;
      lVar17 = lVar28;
      uVar25 = uVar18;
    }
    Vector<long,_std::allocator<long>_>::~Vector(&phi);
    Vector<long,_std::allocator<long>_>::~Vector(&next);
    Vector<bool,_std::allocator<bool>_>::~Vector(&sieve);
    Vector<int,_std::allocator<int>_>::~Vector(&tree.tree_);
    iVar10 = iVar10 + local_110 + lVar30 + ~uVar9;
    Vector<int,_std::allocator<int>_>::~Vector(&mu);
    Vector<int,_std::allocator<int>_>::~Vector(&lpf);
    Vector<int,_std::allocator<int>_>::~Vector(&primes);
  }
  return iVar10;
}

Assistant:

int64_t pi_lmo4(int64_t x)
{
  if (x < 2)
    return 0;

  int threads = 1;
  double alpha = get_alpha_lmo(x);
  int64_t x13 = iroot<3>(x);
  int64_t y = (int64_t) (x13 * alpha);
  int64_t c = PhiTiny::get_c(y);

  auto primes = generate_primes<int32_t>(y);
  auto lpf = generate_lpf(y);
  auto mu = generate_moebius(y);

  int64_t pi_y = primes.size() - 1;
  int64_t p2 = P2(x, y, pi_y, threads);
  int64_t s1 = S1(x, y, c, threads);
  int64_t s2 = S2(x, y, c, pi_y, primes, lpf, mu);
  int64_t phi = s1 + s2;
  int64_t sum = phi + pi_y - 1 - p2;

  return sum;
}